

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  undefined4 uVar1;
  int iVar2;
  char *pcStack_38;
  int tok;
  char *next;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  next = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)parser;
  do {
    pcStack_38 = (char *)0x0;
    uVar1 = (*(code *)**(undefined8 **)(s_local + 0x120))
                      (*(undefined8 **)(s_local + 0x120),end_local,nextPtr_local,
                       &stack0xffffffffffffffc8);
    *(char **)(s_local + 0x210) = pcStack_38;
    switch(uVar1) {
    case 0:
      *(char **)(s_local + 0x208) = pcStack_38;
      return XML_ERROR_INVALID_TOKEN;
    case 0xb:
      iVar2 = reportProcessingInstruction
                        ((XML_Parser)s_local,*(ENCODING **)(s_local + 0x120),end_local,pcStack_38);
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xd:
      iVar2 = reportComment((XML_Parser)s_local,*(ENCODING **)(s_local + 0x120),end_local,pcStack_38
                           );
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xf:
      if (*(long *)(s_local + 0xa0) != 0) {
        reportDefault((XML_Parser)s_local,*(ENCODING **)(s_local + 0x120),end_local,pcStack_38);
      }
      break;
    case 0xfffffff1:
      if ((*(long *)(s_local + 0xa0) != 0) &&
         (reportDefault((XML_Parser)s_local,*(ENCODING **)(s_local + 0x120),end_local,pcStack_38),
         *(int *)(s_local + 0x370) == 2)) {
        return XML_ERROR_ABORTED;
      }
      *(char **)next = pcStack_38;
      return XML_ERROR_NONE;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    case 0xfffffffc:
      *(char **)next = end_local;
      return XML_ERROR_NONE;
    case 0xfffffffe:
      if (s_local[0x374] == '\0') {
        *(char **)next = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case 0xffffffff:
      if (s_local[0x374] == '\0') {
        *(char **)next = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    }
    end_local = pcStack_38;
    *(char **)(s_local + 0x208) = pcStack_38;
    if (*(int *)(s_local + 0x370) == 2) {
      return XML_ERROR_ABORTED;
    }
  } while (*(int *)(s_local + 0x370) != 3);
  *(char **)next = pcStack_38;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error PTRCALL
epilogProcessor(XML_Parser parser, const char *s, const char *end,
                const char **nextPtr) {
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  for (;;) {
    const char *next = NULL;
    int tok = XmlPrologTok(parser->m_encoding, s, end, &next);
#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                  XML_ACCOUNT_DIRECT)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
#endif
    parser->m_eventEndPtr = next;
    switch (tok) {
    /* report partial linebreak - it might be the last token */
    case -XML_TOK_PROLOG_S:
      if (parser->m_defaultHandler) {
        reportDefault(parser, parser->m_encoding, s, next);
        if (parser->m_parsingStatus.parsing == XML_FINISHED)
          return XML_ERROR_ABORTED;
      }
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      *nextPtr = s;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (parser->m_defaultHandler)
        reportDefault(parser, parser->m_encoding, s, next);
      break;
    case XML_TOK_PI:
      if (! reportProcessingInstruction(parser, parser->m_encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (! reportComment(parser, parser->m_encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (! parser->m_parsingStatus.finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (! parser->m_parsingStatus.finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    parser->m_eventPtr = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default:;
    }
  }
}